

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O2

TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> __thiscall
TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::PopItem
          (TPZDohrThreadMultList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
           *this)

{
  TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> extraout_RDX;
  long in_RSI;
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> TVar1;
  
  TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>::TPZDohrThreadMultData
            ((TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *)this);
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(in_RSI + 0x18))->__data);
  if (*(long *)(in_RSI + 0x58) != 0) {
    TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>::operator=
              ((TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *)this,
               (TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_> *)
               ((((list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                   *)(in_RSI + 0x48))->
                super__List_base<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::
    list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ::pop_front((list<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrThreadMultData<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                 *)(in_RSI + 0x48));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x18));
  TVar1.fSub.fRef = extraout_RDX.fRef;
  TVar1._0_8_ = this;
  return TVar1;
}

Assistant:

TPZDohrThreadMultData<TSubStruct> PopItem()
	{
		TPZDohrThreadMultData<TSubStruct> result;
    std::scoped_lock<std::mutex> lock(fAccessLock);
		if (fWork.size()) {
			result = *fWork.begin();
			fWork.pop_front();
		}
		return result;
	}